

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_ai.cpp
# Opt level: O1

string * __thiscall cpp_client::Base_ai::get_setting_abi_cxx11_(Base_ai *this,char *key)

{
  int iVar1;
  const_iterator cVar2;
  undefined8 uVar3;
  string *psVar4;
  allocator local_41;
  key_type local_40;
  
  if (get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_);
    if (iVar1 != 0) {
      get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_._M_dataplus._M_p =
           (pointer)&get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_);
    }
  }
  std::__cxx11::string::string((string *)&local_40,key,&local_41);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->passed_params_)._M_h,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    psVar4 = &get_setting[abi:cxx11](char_const*)::dummy_abi_cxx11_;
  }
  else {
    std::__cxx11::string::string((string *)&local_40,key,&local_41);
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->passed_params_)._M_h,&local_40);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar3 = std::__throw_out_of_range("_Map_base::at");
      __clang_call_terminate(uVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    psVar4 = (string *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur + 0x28);
  }
  return psVar4;
}

Assistant:

const std::string& Base_ai::get_setting(const char* key) const noexcept
{
   // Have a dummy string for return null if needed
   static const std::string dummy{""};
   if(passed_params_.count(key))
   {
      return passed_params_.at(key);
   }
   else
   {
      return dummy;
   }
}